

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::KeywordNameSyntax::isKind(SyntaxKind kind)

{
  if ((((ArrayXorMethod < kind) || ((0xd800000U >> (kind & AssertionItemPortList) & 1) == 0)) &&
      ((0x37 < kind - SuperHandle ||
       ((0x80000000000081U >> ((ulong)(kind - SuperHandle) & 0x3f) & 1) == 0)))) &&
     (((kind != ConstructorName && (kind != LocalScope)) && (kind != RootScope)))) {
    return false;
  }
  return true;
}

Assistant:

bool KeywordNameSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ArrayAndMethod:
        case SyntaxKind::ArrayOrMethod:
        case SyntaxKind::ArrayUniqueMethod:
        case SyntaxKind::ArrayXorMethod:
        case SyntaxKind::ConstructorName:
        case SyntaxKind::LocalScope:
        case SyntaxKind::RootScope:
        case SyntaxKind::SuperHandle:
        case SyntaxKind::ThisHandle:
        case SyntaxKind::UnitScope:
            return true;
        default:
            return false;
    }
}